

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

GeometryShaderOutputType sglr::rr_util::mapGLGeometryShaderOutputType(deUint32 primitive)

{
  undefined4 local_c;
  deUint32 primitive_local;
  
  if (primitive == 0) {
    local_c = GEOMETRYSHADEROUTPUTTYPE_POINTS;
  }
  else if (primitive == 3) {
    local_c = GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP;
  }
  else if (primitive == 5) {
    local_c = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  }
  else {
    local_c = GEOMETRYSHADEROUTPUTTYPE_LAST;
  }
  return local_c;
}

Assistant:

rr::GeometryShaderOutputType mapGLGeometryShaderOutputType (deUint32 primitive)
{
	switch (primitive)
	{
		case GL_POINTS:				return rr::GEOMETRYSHADEROUTPUTTYPE_POINTS;
		case GL_LINE_STRIP:			return rr::GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP;
		case GL_TRIANGLE_STRIP:		return rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
		default:
			DE_ASSERT(DE_FALSE);
			return rr::GEOMETRYSHADEROUTPUTTYPE_LAST;
	}
}